

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O2

void __thiscall CGameContext::OnClientPredictedInput(CGameContext *this,int ClientID,void *pInput)

{
  CNetObjHandler *this_00;
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char aBuf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_World).m_Paused == false) {
    this_00 = &this->m_NetObjHandler;
    iVar2 = CNetObjHandler::NumObjFailures(this_00);
    iVar3 = CNetObjHandler::ValidateObj(this_00,1,pInput,0x28);
    if (iVar3 != -1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        CPlayer::OnPredictedInput(this->m_apPlayers[ClientID],(CNetObj_PlayerInput *)pInput);
        return;
      }
      goto LAB_0011543e;
    }
    if (this->m_pConfig->m_Debug != 0) {
      iVar3 = CNetObjHandler::NumObjFailures(this_00);
      if (iVar2 != iVar3) {
        pcVar4 = CNetObjHandler::FailedObjOn(this_00);
        str_format(aBuf,0x80,"NETOBJTYPE_PLAYERINPUT corrected on \'%s\'",pcVar4);
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,2,"server",aBuf,0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0011543e:
  __stack_chk_fail();
}

Assistant:

void CGameContext::OnClientPredictedInput(int ClientID, void *pInput)
{
	if(!m_World.m_Paused)
	{
		int NumFailures = m_NetObjHandler.NumObjFailures();
		if(m_NetObjHandler.ValidateObj(NETOBJTYPE_PLAYERINPUT, pInput, sizeof(CNetObj_PlayerInput)) == -1)
		{
			if(Config()->m_Debug && NumFailures != m_NetObjHandler.NumObjFailures())
			{
				char aBuf[128];
				str_format(aBuf, sizeof(aBuf), "NETOBJTYPE_PLAYERINPUT corrected on '%s'", m_NetObjHandler.FailedObjOn());
				Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "server", aBuf);
			}
		}
		else
			m_apPlayers[ClientID]->OnPredictedInput((CNetObj_PlayerInput *)pInput);
	}
}